

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatOrderH.c
# Opt level: O0

Msat_Order_t * Msat_OrderAlloc(Msat_Solver_t *pSat)

{
  Msat_Order_t *p_00;
  Msat_IntVec_t *pMVar1;
  Msat_Order_t *p;
  Msat_Solver_t *pSat_local;
  
  p_00 = (Msat_Order_t *)malloc(0x18);
  memset(p_00,0,0x18);
  p_00->pSat = pSat;
  pMVar1 = Msat_IntVecAlloc(0);
  p_00->vIndex = pMVar1;
  pMVar1 = Msat_IntVecAlloc(0);
  p_00->vHeap = pMVar1;
  Msat_OrderSetBounds(p_00,pSat->nVarsAlloc);
  return p_00;
}

Assistant:

Msat_Order_t * Msat_OrderAlloc( Msat_Solver_t * pSat )
{
    Msat_Order_t * p;
    p = ABC_ALLOC( Msat_Order_t, 1 );
    memset( p, 0, sizeof(Msat_Order_t) );
    p->pSat   = pSat;
    p->vIndex = Msat_IntVecAlloc( 0 );
    p->vHeap  = Msat_IntVecAlloc( 0 );
    Msat_OrderSetBounds( p, pSat->nVarsAlloc );
    return p;
}